

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-gui.cpp
# Opt level: O1

stStateUI * __thiscall TripleBuffer<stStateUI>::get(TripleBuffer<stStateUI> *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar1 == 0) {
    if (this->hasChanged == true) {
      stStateUI::operator=(&this->out,&this->buffer);
      this->hasChanged = false;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return &this->out;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

const T & get() {
        std::lock_guard<std::mutex> lock(mutex);
        if (hasChanged) {
            out = buffer;
            hasChanged = false;
        }

        return out;
    }